

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cc
# Opt level: O0

size_t __thiscall
InputSource::read_line(InputSource *this,string *str,size_t count,qpdf_offset_t at)

{
  size_t sVar1;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  _If_sv<std::basic_string_view<char>,_size_type> local_50;
  _If_sv<std::basic_string_view<char>,_size_type> next_line;
  size_type local_38;
  _If_sv<std::basic_string_view<char>,_size_type> eol;
  qpdf_offset_t at_local;
  size_t count_local;
  string *str_local;
  InputSource *this_local;
  
  eol = at;
  at_local = count;
  count_local = (size_t)str;
  str_local = (string *)this;
  read(this,(int)str,(void *)count,at);
  sVar1 = count_local;
  _next_line = sv("\n\r",2);
  local_38 = std::__cxx11::string::
             find_first_of<std::basic_string_view<char,std::char_traits<char>>>
                       ((string *)sVar1,
                        (basic_string_view<char,_std::char_traits<char>_> *)&next_line,0);
  sVar1 = count_local;
  if (local_38 != 0xffffffffffffffff) {
    local_60 = sv("\n\r",2);
    local_50 = std::__cxx11::string::
               find_first_not_of<std::basic_string_view<char,std::char_traits<char>>>
                         ((string *)sVar1,&local_60,local_38);
    std::__cxx11::string::resize(count_local);
    if (local_38 != 0xffffffffffffffff) {
      (*this->_vptr_InputSource[5])(this,this->last_offset + local_50,0);
      return local_38;
    }
  }
  (*this->_vptr_InputSource[5])(this,this->last_offset,0);
  (*this->_vptr_InputSource[2])();
  return local_38;
}

Assistant:

size_t
InputSource::read_line(std::string& str, size_t count, qpdf_offset_t at)
{
    // Return at most max_line_length characters from the next line. Lines are terminated by one or
    // more \r or \n characters. Consume the trailing newline characters but don't return them.
    // After this is called, the file will be positioned after a line terminator or at the end of
    // the file, and last_offset will point to position the file had when this method was called.

    read(str, count, at);
    auto eol = str.find_first_of("\n\r"sv);
    if (eol != std::string::npos) {
        auto next_line = str.find_first_not_of("\n\r"sv, eol);
        str.resize(eol);
        if (eol != std::string::npos) {
            seek(last_offset + static_cast<qpdf_offset_t>(next_line), SEEK_SET);
            return eol;
        }
    }
    // We did not necessarily find the end of the trailing newline sequence.
    seek(last_offset, SEEK_SET);
    findAndSkipNextEOL();
    return eol;
}